

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O1

deBool dePoolArray_reserve(dePoolArray *arr,int size)

{
  int iVar1;
  void **ppvVar2;
  ulong uVar3;
  void **ppvVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (arr->capacity <= size) {
    iVar8 = size + 0xf >> 4;
    if (arr->pageTableCapacity < iVar8) {
      iVar1 = arr->pageTableCapacity * 2;
      if (iVar1 <= iVar8) {
        iVar1 = iVar8;
      }
      ppvVar2 = (void **)deMemPool_alloc(arr->pool,(long)iVar1 << 3);
      if (ppvVar2 == (void **)0x0) {
        iVar9 = 0;
        ppvVar4 = (void **)0x0;
      }
      else {
        iVar9 = arr->pageTableCapacity;
        uVar3 = 0;
        if (0 < (long)iVar9) {
          do {
            ppvVar2[uVar3] = arr->pageTable[uVar3];
            uVar3 = uVar3 + 1;
          } while ((long)iVar9 != uVar3);
        }
        if ((int)(uint)uVar3 < iVar1) {
          memset(ppvVar2 + (uVar3 & 0xffffffff),0,(ulong)(~(uint)uVar3 + iVar1) * 8 + 8);
        }
        ppvVar4 = arr->pageTable;
        iVar9 = iVar9 << 3;
        arr->pageTable = ppvVar2;
        arr->pageTableCapacity = iVar1;
      }
      if (ppvVar2 == (void **)0x0) {
        return 0;
      }
    }
    else {
      iVar9 = 0;
      ppvVar4 = (void **)0x0;
    }
    iVar1 = arr->elementSize;
    iVar6 = iVar1 * 0x10;
    uVar10 = arr->capacity >> 4;
    for (; uVar3 = (ulong)uVar10, iVar6 <= iVar9; iVar9 = iVar9 + iVar1 * -0x10) {
      lVar7 = (long)(int)uVar10;
      uVar10 = uVar10 + 1;
      arr->pageTable[lVar7] = ppvVar4;
      ppvVar4 = (void **)((long)ppvVar4 + (long)iVar6);
    }
    if ((int)uVar10 < iVar8) {
      uVar3 = (ulong)(int)uVar10;
      do {
        pvVar5 = deMemPool_alloc(arr->pool,(long)iVar6);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
        arr->pageTable[uVar3] = pvVar5;
        uVar3 = uVar3 + 1;
      } while ((long)iVar8 != uVar3);
    }
    arr->capacity = (int)uVar3 << 4;
  }
  return 1;
}

Assistant:

deBool			dePoolArray_reserve			(dePoolArray* arr, int size)
{
	if (size >= arr->capacity)
	{
		void*	oldPageTable			= DE_NULL;
		int		oldPageTableSize		= 0;

		int		newCapacity				= deAlign32(size, 1 << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2);
		int		reqPageTableCapacity	= newCapacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

		if (arr->pageTableCapacity < reqPageTableCapacity)
		{
			int		newPageTableCapacity	= deMax32(2*arr->pageTableCapacity, reqPageTableCapacity);
			void**	newPageTable			= (void**)deMemPool_alloc(arr->pool, (size_t)newPageTableCapacity * sizeof(void*));
			int		i;

			if (!newPageTable)
				return DE_FALSE;

			for (i = 0; i < arr->pageTableCapacity; i++)
				newPageTable[i] = arr->pageTable[i];

			for (; i < newPageTableCapacity; i++)
				newPageTable[i] = DE_NULL;

			/* Grab information about old page table for recycling purposes. */
			oldPageTable		= arr->pageTable;
			oldPageTableSize	= arr->pageTableCapacity * (int)sizeof(void*);

			arr->pageTable			= newPageTable;
			arr->pageTableCapacity	= newPageTableCapacity;
		}

		/* Allocate new pages. */
		{
			int pageAllocSize = arr->elementSize << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			int pageTableNdx = arr->capacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

			/* Allocate new pages from recycled old page table. */
			while (oldPageTableSize >= pageAllocSize)
			{
				void* newPage = oldPageTable;
				DE_ASSERT(arr->pageTableCapacity > pageTableNdx); /* \todo [petri] is this always true? */
				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx++] = newPage;

				oldPageTable = (void*)((deUint8*)oldPageTable + pageAllocSize);
				oldPageTableSize -= pageAllocSize;
			}

			/* Allocate the rest of the needed pages from the pool. */
			for (; pageTableNdx < reqPageTableCapacity; pageTableNdx++)
			{
				void* newPage = deMemPool_alloc(arr->pool, (size_t)pageAllocSize);
				if (!newPage)
					return DE_FALSE;

				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx] = newPage;
			}

			arr->capacity = pageTableNdx << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			DE_ASSERT(arr->capacity >= newCapacity);
		}
	}

	return DE_TRUE;
}